

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * sx_skip_whitespace(char *str)

{
  byte bVar1;
  
  bVar1 = *str;
  while (((bVar1 != 0 && (bVar1 < 0x21)) && ((0x80001f00U >> (bVar1 - 1 & 0x1f) & 1) != 0))) {
    bVar1 = str[1];
    str = str + 1;
  }
  return str;
}

Assistant:

const char* sx_skip_whitespace(const char* str)
{
    while (*str) {
        if (sx_isspace(*str))
            ++str;
        else
            break;
    }
    return str;
}